

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

void __thiscall Raytracer::Scene::start(Scene *this,Image *img)

{
  pointer ppSVar1;
  int iVar2;
  int y;
  Shape **i;
  pointer ppSVar3;
  int iVar4;
  ulong uVar5;
  Vec3f VVar7;
  RGB color;
  vector<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_> *__range3;
  Camera local_78;
  Scene *local_68;
  float local_5c;
  float local_58;
  int local_54;
  Vec3f *local_50;
  undefined8 local_48;
  undefined4 local_40;
  Vec3f local_3c;
  undefined8 extraout_XMM0_Qa;
  float fVar6;
  
  iVar4 = img->height;
  if (0 < iVar4) {
    local_50 = &(this->camera).origin;
    iVar2 = img->width;
    y = 0;
    local_68 = this;
    do {
      if (0 < iVar2) {
        iVar4 = 0;
        do {
          local_5c = (float)iVar4;
          local_54 = -0x40800000;
          local_58 = (float)y;
          VVar7 = Camera::WorldToCamera(&local_78,local_50,(Image *)&local_5c);
          local_48 = 0;
          local_40 = 0;
          local_3c.z = local_78.origin.z;
          local_3c.x = local_78.origin.x;
          local_3c.y = local_78.origin.y;
          ppSVar1 = (local_68->objects).
                    super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppSVar3 = (local_68->objects).
                         super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppSVar3 != ppSVar1;
              ppSVar3 = ppSVar3 + 1) {
            local_78.origin.x = 0.0;
            local_78.origin.y = 0.0;
            local_78.origin.z = 0.0;
            iVar2 = (*(*ppSVar3)->_vptr_Shape[2])(VVar7._0_8_,*ppSVar3,&local_48,&local_78);
            uVar5 = 0x437f0000;
            if ((char)iVar2 == '\0') {
              uVar5 = 0;
            }
            color.b = 0.0;
            color.r = (float)(int)uVar5;
            color.g = (float)(int)(uVar5 >> 0x20);
            fVar6 = 0.0;
            Image::Update(img,y,iVar4,color);
            VVar7.z = fVar6;
            VVar7.x = (float)(int)extraout_XMM0_Qa;
            VVar7.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
          }
          iVar4 = iVar4 + 1;
          iVar2 = img->width;
        } while (iVar4 < iVar2);
        iVar4 = img->height;
      }
      y = y + 1;
    } while (y < iVar4);
  }
  return;
}

Assistant:

void Raytracer::Scene::start(Raytracer::Image & img) {
    for(int y = 0;y<img.height;y++){
        for(int x = 0;x<img.width;x++) {

            Raytracer::Ray ray(Vec3f(0,0,0),camera.WorldToCamera(Vec3f(x,y,-1),img));
            for(auto &i : objects){
                Vec3f usless;
                if(i->isRayIntersect(ray,usless)){
                    img.Update(y,x,RGB(255, 0, 0));
                }else{
                    img.Update(y,x,RGB(0, 0, 0));
                }
            }
        }
    }
}